

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O2

HTTPAPIEX_HANDLE
createIotHubHttpApiExHandle(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *u2bLLClientData)

{
  int *value;
  HTTPAPIEX_RESULT HVar1;
  size_t in_RAX;
  HTTPAPIEX_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  size_t curl_verbose;
  
  curl_verbose = in_RAX;
  handle = HTTPAPIEX_Create(u2bLLClientData->hostname);
  if (handle == (HTTPAPIEX_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (HTTPAPIEX_HANDLE)0x0;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
              ,"createIotHubHttpApiExHandle",0x199,1,"unable to HTTPAPIEX_Create");
    return (HTTPAPIEX_HANDLE)0x0;
  }
  if ((u2bLLClientData->blob_upload_timeout_millisecs == 0) ||
     (HVar1 = HTTPAPIEX_SetOption(handle,"timeout",&u2bLLClientData->blob_upload_timeout_millisecs),
     HVar1 == HTTPAPIEX_OK)) {
    if (u2bLLClientData->curl_verbosity_level != UPLOADTOBLOB_CURL_VERBOSITY_UNSET) {
      curl_verbose = (size_t)(u2bLLClientData->curl_verbosity_level ==
                             UPLOADTOBLOB_CURL_VERBOSITY_ON);
      HTTPAPIEX_SetOption(handle,"CURLOPT_VERBOSE",&curl_verbose);
    }
    if ((u2bLLClientData->networkInterface == (char *)0x0) ||
       (HVar1 = HTTPAPIEX_SetOption(handle,"CURLOPT_INTERFACE",u2bLLClientData->networkInterface),
       HVar1 == HTTPAPIEX_OK)) {
      if (((u2bLLClientData->cred_type & ~IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) ==
           IOTHUB_CREDENTIAL_TYPE_X509) &&
         (((((u2bLLClientData->tls_renegotiation == true &&
             (HVar1 = HTTPAPIEX_SetOption(handle,"tls_renegotiation",
                                          &u2bLLClientData->tls_renegotiation),
             HVar1 != HTTPAPIEX_OK)) ||
            (HVar1 = HTTPAPIEX_SetOption(handle,"x509certificate",
                                         (u2bLLClientData->credentials).x509_credentials.
                                         x509certificate), HVar1 != HTTPAPIEX_OK)) ||
           (HVar1 = HTTPAPIEX_SetOption(handle,"x509privatekey",
                                        (u2bLLClientData->credentials).x509_credentials.
                                        x509privatekey), HVar1 != HTTPAPIEX_OK)) ||
          (((value = (u2bLLClientData->credentials).x509_credentials.x509privatekeyType,
            value != (int *)0x0 &&
            (HVar1 = HTTPAPIEX_SetOption(handle,"x509PrivatekeyType",value), HVar1 != HTTPAPIEX_OK))
           || ((pcVar4 = (u2bLLClientData->credentials).x509_credentials.engine,
               pcVar4 != (char *)0x0 &&
               (HVar1 = HTTPAPIEX_SetOption(handle,"Engine",pcVar4), HVar1 != HTTPAPIEX_OK)))))))) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00126f90;
        pcVar4 = "unable to HTTPAPIEX_SetOption for x509 certificate";
        iVar3 = 0x1bb;
      }
      else if ((u2bLLClientData->certificates == (char *)0x0) ||
              (HVar1 = HTTPAPIEX_SetOption(handle,"TrustedCerts",u2bLLClientData->certificates),
              HVar1 == HTTPAPIEX_OK)) {
        if ((u2bLLClientData->http_proxy_options).host_address == (char *)0x0) {
          return handle;
        }
        HVar1 = HTTPAPIEX_SetOption(handle,"proxy_data",&u2bLLClientData->http_proxy_options);
        if (HVar1 == HTTPAPIEX_OK) {
          return handle;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00126f90;
        pcVar4 = "unable to set http proxy!";
        iVar3 = 0x1c9;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00126f90;
        pcVar4 = "unable to set TrustedCerts!";
        iVar3 = 0x1c2;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00126f90;
      pcVar4 = "unable to set networkInteface!";
      iVar3 = 0x1ad;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00126f90;
    pcVar4 = "unable to set blob transfer timeout";
    iVar3 = 0x19e;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
            ,"createIotHubHttpApiExHandle",iVar3,1,pcVar4);
LAB_00126f90:
  HTTPAPIEX_Destroy(handle);
  return (HTTPAPIEX_HANDLE)0x0;
}

Assistant:

static HTTPAPIEX_HANDLE createIotHubHttpApiExHandle(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* u2bLLClientData)
{
    HTTPAPIEX_HANDLE iotHubHttpApiExHandle = HTTPAPIEX_Create(u2bLLClientData->hostname);

    if (iotHubHttpApiExHandle == NULL)
    {
        LogError("unable to HTTPAPIEX_Create");
    }
    else if (u2bLLClientData->blob_upload_timeout_millisecs != 0 &&
             HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_HTTP_TIMEOUT, &u2bLLClientData->blob_upload_timeout_millisecs) != HTTPAPIEX_OK)
    {
        LogError("unable to set blob transfer timeout");
        HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
        iotHubHttpApiExHandle = NULL;
    }
    else
    {
        if (u2bLLClientData->curl_verbosity_level != UPLOADTOBLOB_CURL_VERBOSITY_UNSET)
        {
            size_t curl_verbose = (u2bLLClientData->curl_verbosity_level == UPLOADTOBLOB_CURL_VERBOSITY_ON);
            (void)HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_CURL_VERBOSE, &curl_verbose);
        }

        if ((u2bLLClientData->networkInterface) != NULL &&
            (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_CURL_INTERFACE, u2bLLClientData->networkInterface) != HTTPAPIEX_OK))
        {
            LogError("unable to set networkInteface!");
            HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
            iotHubHttpApiExHandle = NULL;
        }
        else
        {
            /*transmit the x509certificate and x509privatekey*/
            if ((u2bLLClientData->cred_type == IOTHUB_CREDENTIAL_TYPE_X509 || u2bLLClientData->cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC) &&
                    (((u2bLLClientData->tls_renegotiation == true) && (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_SET_TLS_RENEGOTIATION, &u2bLLClientData->tls_renegotiation) != HTTPAPIEX_OK)) ||
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_X509_CERT, u2bLLClientData->credentials.x509_credentials.x509certificate) != HTTPAPIEX_OK) ||
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_X509_PRIVATE_KEY, u2bLLClientData->credentials.x509_credentials.x509privatekey) != HTTPAPIEX_OK) ||
                    ((u2bLLClientData->credentials.x509_credentials.x509privatekeyType != NULL) && (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_OPENSSL_PRIVATE_KEY_TYPE, u2bLLClientData->credentials.x509_credentials.x509privatekeyType) != HTTPAPIEX_OK)) ||
                    ((u2bLLClientData->credentials.x509_credentials.engine != NULL) && (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_OPENSSL_ENGINE, u2bLLClientData->credentials.x509_credentials.engine) != HTTPAPIEX_OK))))
            {
                LogError("unable to HTTPAPIEX_SetOption for x509 certificate");
                HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
                iotHubHttpApiExHandle = NULL;
            }
            else if ((u2bLLClientData->certificates != NULL) &&
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_TRUSTED_CERT, u2bLLClientData->certificates) != HTTPAPIEX_OK))
            {
                LogError("unable to set TrustedCerts!");
                HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
                iotHubHttpApiExHandle = NULL;
            }
            else if ((u2bLLClientData->http_proxy_options.host_address != NULL) &&
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_HTTP_PROXY, &(u2bLLClientData->http_proxy_options)) != HTTPAPIEX_OK))
            {
                LogError("unable to set http proxy!");
                HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
                iotHubHttpApiExHandle = NULL;
            }
            // TODO: proxy username and password can be set through SetOption, but are not used (it was the previous behavior as well). Bug?
        }
    }

    return iotHubHttpApiExHandle;
}